

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

int Fra_SmlNodeCountOnes(Fra_Sml_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = p->nWordsTotal;
  iVar2 = pObj->Id;
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  iVar4 = 0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    iVar3 = Aig_WordCountOnes(*(uint *)((long)&p[1].pAig +
                                       uVar5 * 4 + (long)(int)(iVar2 * uVar1) * 4));
    iVar4 = iVar4 + iVar3;
  }
  return iVar4;
}

Assistant:

int Fra_SmlNodeCountOnes( Fra_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i, Counter = 0;
    pSims = Fra_ObjSim(p, pObj->Id);
    for ( i = 0; i < p->nWordsTotal; i++ )
        Counter += Aig_WordCountOnes( pSims[i] );
    return Counter;
}